

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall blc::network::Server::resume(Server *this)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x28))->__data);
  this[0x20] = (Server)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x28));
  return;
}

Assistant:

void blc::network::Server::resume() {
	this->_mutex.lock();
	this->_stop = false;
	this->_mutex.unlock();
}